

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

bool __thiscall
diligent_spirv_cross::CompilerGLSL::is_stage_output_variable_masked
          (CompilerGLSL *this,SPIRVariable *var)

{
  ID id;
  bool bVar1;
  uint32_t uVar2;
  SPIRType *pSVar3;
  _Node_iterator_base<diligent_spirv_cross::LocationComponentPair,_true> _Var4;
  uint32_t local_24;
  key_type local_20;
  
  pSVar3 = Variant::get<diligent_spirv_cross::SPIRType>
                     ((this->super_Compiler).ir.ids.super_VectorView<diligent_spirv_cross::Variant>.
                      ptr + *(uint *)&(var->super_IVariant).field_0xc);
  bVar1 = Compiler::has_decoration(&this->super_Compiler,(ID)(pSVar3->super_IVariant).self.id,Block)
  ;
  if (bVar1) {
LAB_0076cf94:
    bVar1 = false;
  }
  else {
    bVar1 = Compiler::has_decoration
                      (&this->super_Compiler,(ID)(var->super_IVariant).self.id,BuiltIn);
    id.id = (var->super_IVariant).self.id;
    if (bVar1) {
      local_24 = Compiler::get_decoration(&this->super_Compiler,id,BuiltIn);
      _Var4._M_cur = (__node_type *)
                     ::std::
                     _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::find(&(this->masked_output_builtins)._M_h,&local_24);
    }
    else {
      bVar1 = Compiler::has_decoration(&this->super_Compiler,id,DecorationLocation);
      if (!bVar1) goto LAB_0076cf94;
      uVar2 = Compiler::get_decoration
                        (&this->super_Compiler,(ID)(var->super_IVariant).self.id,DecorationLocation)
      ;
      local_20.component =
           Compiler::get_decoration
                     (&this->super_Compiler,(ID)(var->super_IVariant).self.id,Component);
      local_20.location = uVar2;
      _Var4._M_cur = (__node_type *)
                     ::std::
                     _Hashtable<diligent_spirv_cross::LocationComponentPair,_diligent_spirv_cross::LocationComponentPair,_std::allocator<diligent_spirv_cross::LocationComponentPair>,_std::__detail::_Identity,_std::equal_to<diligent_spirv_cross::LocationComponentPair>,_diligent_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     ::find(&(this->masked_output_locations)._M_h,&local_20);
    }
    bVar1 = _Var4._M_cur != (__node_type *)0x0;
  }
  return bVar1;
}

Assistant:

bool CompilerGLSL::is_stage_output_variable_masked(const SPIRVariable &var) const
{
	auto &type = get<SPIRType>(var.basetype);
	bool is_block = has_decoration(type.self, DecorationBlock);
	// Blocks by themselves are never masked. Must be masked per-member.
	if (is_block)
		return false;

	bool is_builtin = has_decoration(var.self, DecorationBuiltIn);

	if (is_builtin)
	{
		return is_stage_output_builtin_masked(BuiltIn(get_decoration(var.self, DecorationBuiltIn)));
	}
	else
	{
		if (!has_decoration(var.self, DecorationLocation))
			return false;

		return is_stage_output_location_masked(
				get_decoration(var.self, DecorationLocation),
				get_decoration(var.self, DecorationComponent));
	}
}